

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
ConvertToNonSharedSimpleDictionaryType
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  int *piVar1;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *pSVar2;
  
  if ((this->field_0x28 & 2) == 0) {
    pSVar2 = (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)
             SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
             ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>,Js::JavascriptString*>
                       ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this,
                        instance);
  }
  else {
    pSVar2 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
             ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>
                       ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this,
                        instance);
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleSharedDictionaryToNonSharedCount;
  *piVar1 = *piVar1 + 1;
  return &pSVar2->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToNonSharedSimpleDictionaryType(DynamicObject* instance)
    {
        // Although an unordered type handler is never actually shared, it can be flagged as shared by type snapshot enumeration
        // to freeze the initial type handler before enumeration commences
        SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* newTypeHandler =
            isUnordered
                ? ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                : ConvertToTypeHandler<SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>, TMapKey>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleSharedDictionaryToNonSharedCount++;
#endif
        return newTypeHandler;
    }